

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O0

void __thiscall
QGraphicsProxyWidget::dragLeaveEvent(QGraphicsProxyWidget *this,QGraphicsSceneDragDropEvent *event)

{
  bool bVar1;
  QGraphicsProxyWidgetPrivate *pQVar2;
  long in_FS_OFFSET;
  QGraphicsProxyWidgetPrivate *d;
  QDragLeaveEvent proxyDragLeave;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QGraphicsProxyWidget *)0x9bc47a);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x9bc490);
  if ((bVar1) && (pQVar2->dragDropWidget != (QWidget *)0x0)) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QDragLeaveEvent::QDragLeaveEvent((QDragLeaveEvent *)&local_18);
    QCoreApplication::sendEvent(&pQVar2->dragDropWidget->super_QObject,(QEvent *)&local_18);
    pQVar2->dragDropWidget = (QWidget *)0x0;
    QDragLeaveEvent::~QDragLeaveEvent((QDragLeaveEvent *)&local_18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsProxyWidget::dragLeaveEvent(QGraphicsSceneDragDropEvent *event)
{
    Q_UNUSED(event);
#if QT_CONFIG(draganddrop)
    Q_D(QGraphicsProxyWidget);
    if (!d->widget || !d->dragDropWidget)
        return;
    QDragLeaveEvent proxyDragLeave;
    QCoreApplication::sendEvent(d->dragDropWidget, &proxyDragLeave);
    d->dragDropWidget = nullptr;
#endif
}